

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update3_ghosts(Integer g_a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  char *pcVar6;
  C_Integer *pCVar7;
  ushort uVar8;
  Integer proc;
  logical lVar9;
  long grp_id;
  Integer *map;
  ulong *proclist;
  long lVar10;
  long lVar11;
  size_t sVar12;
  Integer IVar13;
  long lVar14;
  ulong uVar15;
  int _d;
  long lVar16;
  ushort uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  C_Integer CVar23;
  long lVar24;
  long idx;
  int iVar25;
  long lVar26;
  int iVar27;
  char *pcVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long ndim;
  int _index [7];
  Integer _hi [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer width [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar9 = pnga_has_ghosts(g_a);
  if (lVar9 != 0) {
    lVar1 = g_a + 1000;
    iVar2 = GA[lVar1].elemsize;
    ndim = (long)GA[lVar1].ndim;
    iVar3 = GA[lVar1].p_handle;
    grp_id = (long)iVar3;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar34 = 0;
    if (0 < ndim) {
      lVar34 = ndim;
    }
    for (lVar26 = 0; lVar34 * 8 - lVar26 != 0; lVar26 = lVar26 + 8) {
      *(undefined8 *)((long)increment + lVar26) = 0;
      *(undefined8 *)((long)width + lVar26) = *(undefined8 *)((long)GA[g_a + 1000].width + lVar26);
      *(undefined8 *)((long)dims + lVar26) = *(undefined8 *)((long)GA[g_a + 1000].dims + lVar26);
      if ((*(long *)((long)lo_loc + lVar26) == 0) && (*(long *)((long)hi_loc + lVar26) == -1)) {
        return 0;
      }
    }
    lVar9 = gai_check_ghost_distr(g_a);
    IVar13 = GAnproc;
    if (lVar9 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
      IVar13 = GAnproc;
    }
    proclist = (ulong *)malloc(IVar13 << 3);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);
    }
    lVar10 = (long)(int)proc;
    lVar11 = ndim + -1;
    lVar26 = 0;
    if (0 < lVar11) {
      lVar26 = lVar11;
    }
    for (idx = 0; idx != lVar34; idx = idx + 1) {
      lVar4 = width[idx];
      if (lVar4 != 0) {
        get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar9 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
        if (lVar9 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar12 = strlen(err_string);
          sprintf(err_string + (int)sVar12," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar12 = strlen(err_string);
          lVar24 = 1;
          while( true ) {
            IVar13 = pnga_ndim(g_a);
            pcVar28 = err_string + (int)sVar12;
            if (IVar13 <= lVar24) break;
            sprintf(pcVar28,",%ld:%ld ",slo_rem[lVar24],shi_rem[lVar24]);
            sVar12 = strlen(err_string);
            lVar24 = lVar24 + 1;
          }
          pcVar28[0] = ']';
          pcVar28[1] = '\0';
          pnga_error(err_string,g_a);
        }
        uVar32 = *proclist;
        pnga_distribution(g_a,uVar32,tlo_rem,thi_rem);
        for (lVar24 = 0; lVar34 != lVar24; lVar24 = lVar24 + 1) {
          if (increment[lVar24] == 0) {
            if (idx == lVar24) {
              plo_rem[idx] = lVar4 + 1 + (thi_rem[idx] - tlo_rem[idx]);
              phi_rem[idx] = (thi_rem[idx] - tlo_rem[idx]) + lVar4 * 2;
              plo_loc[idx] = lVar4;
            }
            else {
              lVar19 = width[lVar24];
              plo_rem[lVar24] = lVar19;
              phi_rem[lVar24] = (thi_rem[lVar24] + lVar19) - tlo_rem[lVar24];
              plo_loc[lVar24] = lVar19;
            }
          }
          else {
            plo_rem[lVar24] = 0;
            phi_rem[lVar24] = (increment[lVar24] + thi_rem[lVar24]) - tlo_rem[lVar24];
            plo_loc[lVar24] = 0;
          }
        }
        uVar17 = GA[lVar1].ndim;
        lVar24 = (long)(short)uVar17;
        iVar30 = GA[lVar1].distr_type;
        if (iVar30 - 1U < 3) {
          lVar18 = lVar10 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          IVar13 = proc;
          lVar19 = 0;
          while (lVar19 + 1 < lVar24) {
            IVar13 = (long)((int)IVar13 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar19];
            lVar18 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar18;
            lVar19 = lVar19 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          for (lVar19 = 0; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            iVar27 = *(int *)((long)_index + lVar19);
            lVar18 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
            *(long *)(err_string + lVar19 * 2) = lVar18 * iVar27 + 1;
            lVar18 = ((long)iVar27 + 1) * lVar18;
            lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
            if (lVar29 <= lVar18) {
              lVar18 = lVar29;
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar18;
          }
        }
        else if (iVar30 == 4) {
          lVar18 = lVar10 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          IVar13 = proc;
          lVar19 = 0;
          while (lVar19 + 1 < lVar24) {
            IVar13 = (long)((int)IVar13 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar19];
            lVar18 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar18;
            lVar19 = lVar19 + 1;
          }
          lVar19 = 0;
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          iVar27 = 0;
          for (; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar25 = *(int *)((long)_index + lVar19);
            lVar29 = (long)iVar27 + (long)iVar25;
            *(C_Integer *)(err_string + lVar19 * 2) = pCVar7[lVar29];
            lVar18 = *(long *)((long)GA[lVar1].num_blocks + lVar19 * 2);
            if ((long)iVar25 < lVar18 + -1) {
              lVar29 = pCVar7[lVar29 + 1] + -1;
            }
            else {
              lVar29 = *(long *)((long)GA[lVar1].dims + lVar19 * 2);
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar29;
            iVar27 = iVar27 + (int)lVar18;
          }
        }
        else if (iVar30 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar19 = 0;
            if (0 < lVar24) {
              lVar19 = lVar24;
            }
            lVar18 = 1;
            for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
              lVar18 = lVar18 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar18 <= proc)) {
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                plo_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
            else {
              lVar18 = 0;
              IVar13 = proc;
              for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                lVar16 = (long)GA[g_a + 1000].nblock[lVar29];
                lVar14 = IVar13 % lVar16;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar29 + -0x20] = pCVar7[lVar14 + lVar18];
                if (lVar14 == lVar16 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar29];
                }
                else {
                  CVar23 = pCVar7[lVar14 + lVar18 + 1] + -1;
                }
                lVar18 = lVar18 + lVar16;
                _hi[lVar29] = CVar23;
                IVar13 = IVar13 / lVar16;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar19 = 0;
            if (0 < lVar24) {
              lVar19 = lVar24;
            }
            lVar18 = 1;
            for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
              lVar18 = lVar18 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar18 <= proc)) {
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                plo_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
            else {
              lVar18 = 0;
              IVar13 = proc;
              for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                lVar16 = (long)GA[g_a + 1000].nblock[lVar29];
                lVar14 = IVar13 % lVar16;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar29 + -0x20] = pCVar7[lVar14 + lVar18];
                if (lVar14 == lVar16 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar29];
                }
                else {
                  CVar23 = pCVar7[lVar14 + lVar18 + 1] + -1;
                }
                lVar18 = lVar18 + lVar16;
                _hi[lVar29] = CVar23;
                IVar13 = IVar13 / lVar16;
              }
            }
          }
          else {
            iVar27 = 0;
            if (0 < (short)uVar17) {
              iVar27 = (int)(short)uVar17;
            }
            for (lVar19 = 0; iVar27 != lVar19; lVar19 = lVar19 + 1) {
              plo_loc[lVar19 + -0x20] = 0;
              _hi[lVar19] = -1;
            }
          }
        }
        lVar19 = lVar24 + -1;
        if (lVar19 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        lVar18 = 0;
        if (0 < lVar19) {
          lVar18 = lVar19;
        }
        lVar14 = 0;
        lVar29 = 1;
        for (lVar16 = 0; lVar18 != lVar16; lVar16 = lVar16 + 1) {
          lVar14 = lVar14 + plo_loc[lVar16] * lVar29;
          lVar20 = (_hi[lVar16] - plo_loc[lVar16 + -0x20]) + GA[g_a + 1000].width[lVar16] * 2 + 1;
          ld_loc[lVar16] = lVar20;
          lVar29 = lVar29 * lVar20;
        }
        lVar16 = plo_loc[lVar24 + -1];
        ppcVar5 = GA[lVar1].ptr;
        iVar27 = GA[lVar1].elemsize;
        pcVar28 = ppcVar5[proc];
        if (iVar30 - 1U < 3) {
          lVar21 = (long)(int)uVar32 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          uVar15 = uVar32;
          lVar20 = 0;
          while (lVar20 + 1 < lVar24) {
            uVar15 = (long)((int)uVar15 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          for (lVar20 = 0; (ulong)uVar8 * 4 != lVar20; lVar20 = lVar20 + 4) {
            iVar30 = *(int *)((long)_index + lVar20);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar20 * 2);
            *(long *)(err_string + lVar20 * 2) = lVar21 * iVar30 + 1;
            lVar21 = ((long)iVar30 + 1) * lVar21;
            lVar31 = *(long *)((long)GA[g_a + 1000].dims + lVar20 * 2);
            if (lVar31 <= lVar21) {
              lVar21 = lVar31;
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar21;
          }
        }
        else if (iVar30 == 4) {
          lVar21 = (long)(int)uVar32 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          uVar15 = uVar32;
          lVar20 = 0;
          while (lVar20 + 1 < lVar24) {
            uVar15 = (long)((int)uVar15 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          lVar20 = 0;
          if ((short)uVar17 < 1) {
            uVar17 = 0;
          }
          iVar30 = 0;
          for (; (ulong)uVar17 * 4 != lVar20; lVar20 = lVar20 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar25 = *(int *)((long)_index + lVar20);
            lVar31 = (long)iVar30 + (long)iVar25;
            *(C_Integer *)(err_string + lVar20 * 2) = pCVar7[lVar31];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2);
            if ((long)iVar25 < lVar21 + -1) {
              lVar31 = pCVar7[lVar31 + 1] + -1;
            }
            else {
              lVar31 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar31;
            iVar30 = iVar30 + (int)lVar21;
          }
        }
        else if (iVar30 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar20 = lVar24;
            if (lVar24 < 1) {
              lVar20 = 0;
            }
            lVar21 = 1;
            for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar31];
            }
            if (((long)uVar32 < 0) || (lVar21 <= (long)uVar32)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar31 = 0;
              uVar15 = uVar32;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar33 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar22 = (long)uVar15 % lVar33;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar21 + -0x20] = pCVar7[lVar22 + lVar31];
                if (lVar22 == lVar33 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar23 = pCVar7[lVar22 + lVar31 + 1] + -1;
                }
                lVar31 = lVar31 + lVar33;
                _hi[lVar21] = CVar23;
                uVar15 = (long)uVar15 / lVar33;
              }
            }
          }
          else if ((long)uVar32 < GA[lVar1].num_rstrctd) {
            lVar20 = lVar24;
            if (lVar24 < 1) {
              lVar20 = 0;
            }
            lVar21 = 1;
            for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar31];
            }
            if (((long)uVar32 < 0) || (lVar21 <= (long)uVar32)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar31 = 0;
              uVar15 = uVar32;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar33 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar22 = (long)uVar15 % lVar33;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar21 + -0x20] = pCVar7[lVar22 + lVar31];
                if (lVar22 == lVar33 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar23 = pCVar7[lVar22 + lVar31 + 1] + -1;
                }
                lVar31 = lVar31 + lVar33;
                _hi[lVar21] = CVar23;
                uVar15 = (long)uVar15 / lVar33;
              }
            }
          }
          else {
            iVar30 = 0;
            if (0 < (short)uVar17) {
              iVar30 = (int)(short)uVar17;
            }
            for (lVar20 = 0; iVar30 != lVar20; lVar20 = lVar20 + 1) {
              plo_loc[lVar20 + -0x20] = 0;
              _hi[lVar20] = -1;
            }
          }
        }
        if (lVar19 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        lVar20 = 0;
        lVar19 = 1;
        for (lVar21 = 0; lVar18 != lVar21; lVar21 = lVar21 + 1) {
          lVar20 = lVar20 + plo_rem[lVar21] * lVar19;
          lVar31 = (_hi[lVar21] - plo_loc[lVar21 + -0x20]) + GA[g_a + 1000].width[lVar21] * 2 + 1;
          ld_rem[lVar21] = lVar31;
          lVar19 = lVar19 * lVar31;
        }
        lVar24 = plo_rem[lVar24 + -1];
        pcVar6 = ppcVar5[uVar32];
        stride_loc[0] = iVar2;
        stride_rem[0] = iVar2;
        iVar30 = iVar2;
        iVar25 = iVar2;
        for (lVar18 = 0; lVar26 * 4 != lVar18; lVar18 = lVar18 + 4) {
          iVar30 = iVar30 * *(int *)((long)ld_rem + lVar18 * 2);
          *(int *)((long)stride_rem + lVar18) = iVar30;
          iVar25 = iVar25 * *(int *)((long)ld_loc + lVar18 * 2);
          *(int *)((long)stride_loc + lVar18) = iVar25;
          *(int *)((long)stride_rem + lVar18 + 4) = iVar30;
          *(int *)((long)stride_loc + lVar18 + 4) = iVar25;
        }
        for (lVar18 = 0; lVar34 != lVar18; lVar18 = lVar18 + 1) {
          count[lVar18] = ((int)phi_rem[lVar18] - (int)plo_rem[lVar18]) + 1;
        }
        count[0] = count[0] * iVar2;
        if (-1 < iVar3) {
          uVar32 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar32];
        }
        ARMCI_PutS(pcVar28 + (lVar29 * lVar16 + lVar14) * (long)iVar27,stride_loc,
                   pcVar6 + (lVar19 * lVar24 + lVar20) * (long)iVar27,stride_rem,count,(int)lVar11,
                   (int)uVar32);
        get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar9 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
        if (lVar9 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar12 = strlen(err_string);
          sprintf(err_string + (int)sVar12," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar12 = strlen(err_string);
          lVar24 = 1;
          while( true ) {
            IVar13 = pnga_ndim(g_a);
            pcVar28 = err_string + (int)sVar12;
            if (IVar13 <= lVar24) break;
            sprintf(pcVar28,",%ld:%ld ",slo_rem[lVar24],shi_rem[lVar24]);
            sVar12 = strlen(err_string);
            lVar24 = lVar24 + 1;
          }
          pcVar28[0] = ']';
          pcVar28[1] = '\0';
          pnga_error(err_string,g_a);
        }
        uVar32 = *proclist;
        pnga_distribution(g_a,uVar32,tlo_rem,thi_rem);
        for (lVar24 = 0; lVar34 != lVar24; lVar24 = lVar24 + 1) {
          if (increment[lVar24] == 0) {
            if (idx == lVar24) {
              plo_rem[idx] = 0;
              phi_rem[idx] = lVar4 + -1;
              plo_loc[idx] = (hi_loc[idx] + lVar4 + -1) - lo_loc[idx];
            }
            else {
              lVar19 = width[lVar24];
              plo_rem[lVar24] = lVar19;
              phi_rem[lVar24] = (thi_rem[lVar24] + lVar19) - tlo_rem[lVar24];
              plo_loc[lVar24] = lVar19;
            }
          }
          else {
            plo_rem[lVar24] = 0;
            phi_rem[lVar24] = (increment[lVar24] + thi_rem[lVar24]) - tlo_rem[lVar24];
            plo_loc[lVar24] = 0;
          }
        }
        uVar17 = GA[lVar1].ndim;
        lVar24 = (long)(short)uVar17;
        iVar30 = GA[lVar1].distr_type;
        if (iVar30 - 1U < 3) {
          lVar18 = lVar10 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          IVar13 = proc;
          lVar19 = 0;
          while (lVar19 + 1 < lVar24) {
            IVar13 = (long)((int)IVar13 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar19];
            lVar18 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar18;
            lVar19 = lVar19 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          for (lVar19 = 0; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            iVar27 = *(int *)((long)_index + lVar19);
            lVar18 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
            *(long *)(err_string + lVar19 * 2) = lVar18 * iVar27 + 1;
            lVar18 = ((long)iVar27 + 1) * lVar18;
            lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
            if (lVar29 <= lVar18) {
              lVar18 = lVar29;
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar18;
          }
        }
        else if (iVar30 == 4) {
          lVar18 = lVar10 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          IVar13 = proc;
          lVar19 = 0;
          while (lVar19 + 1 < lVar24) {
            IVar13 = (long)((int)IVar13 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar19];
            lVar18 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar18;
            lVar19 = lVar19 + 1;
          }
          lVar19 = 0;
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          iVar27 = 0;
          for (; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar25 = *(int *)((long)_index + lVar19);
            lVar29 = (long)iVar27 + (long)iVar25;
            *(C_Integer *)(err_string + lVar19 * 2) = pCVar7[lVar29];
            lVar18 = *(long *)((long)GA[lVar1].num_blocks + lVar19 * 2);
            if ((long)iVar25 < lVar18 + -1) {
              lVar29 = pCVar7[lVar29 + 1] + -1;
            }
            else {
              lVar29 = *(long *)((long)GA[lVar1].dims + lVar19 * 2);
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar29;
            iVar27 = iVar27 + (int)lVar18;
          }
        }
        else if (iVar30 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar19 = 0;
            if (0 < lVar24) {
              lVar19 = lVar24;
            }
            lVar18 = 1;
            for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
              lVar18 = lVar18 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar18 <= proc)) {
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                plo_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
            else {
              lVar29 = 0;
              IVar13 = proc;
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                lVar16 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar14 = IVar13 % lVar16;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar7[lVar14 + lVar29];
                if (lVar14 == lVar16 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar23 = pCVar7[lVar14 + lVar29 + 1] + -1;
                }
                lVar29 = lVar29 + lVar16;
                _hi[lVar18] = CVar23;
                IVar13 = IVar13 / lVar16;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar19 = 0;
            if (0 < lVar24) {
              lVar19 = lVar24;
            }
            lVar18 = 1;
            for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
              lVar18 = lVar18 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar18 <= proc)) {
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                plo_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
            else {
              lVar29 = 0;
              IVar13 = proc;
              for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                lVar16 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar14 = IVar13 % lVar16;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar7[lVar14 + lVar29];
                if (lVar14 == lVar16 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar23 = pCVar7[lVar14 + lVar29 + 1] + -1;
                }
                lVar29 = lVar29 + lVar16;
                _hi[lVar18] = CVar23;
                IVar13 = IVar13 / lVar16;
              }
            }
          }
          else {
            iVar27 = 0;
            if (0 < (short)uVar17) {
              iVar27 = (int)(short)uVar17;
            }
            for (lVar19 = 0; iVar27 != lVar19; lVar19 = lVar19 + 1) {
              plo_loc[lVar19 + -0x20] = 0;
              _hi[lVar19] = -1;
            }
          }
        }
        lVar19 = lVar24 + -1;
        if (lVar19 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        lVar18 = 0;
        if (0 < lVar19) {
          lVar18 = lVar19;
        }
        lVar29 = 1;
        lVar14 = 0;
        for (lVar16 = 0; lVar18 != lVar16; lVar16 = lVar16 + 1) {
          lVar14 = lVar14 + plo_loc[lVar16] * lVar29;
          lVar20 = (_hi[lVar16] - plo_loc[lVar16 + -0x20]) + GA[g_a + 1000].width[lVar16] * 2 + 1;
          ld_loc[lVar16] = lVar20;
          lVar29 = lVar29 * lVar20;
        }
        lVar16 = plo_loc[lVar24 + -1];
        ppcVar5 = GA[lVar1].ptr;
        iVar27 = GA[lVar1].elemsize;
        pcVar28 = ppcVar5[proc];
        if (iVar30 - 1U < 3) {
          lVar21 = (long)(int)uVar32 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          uVar15 = uVar32;
          lVar20 = 0;
          while (lVar20 + 1 < lVar24) {
            uVar15 = (long)((int)uVar15 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar17) {
            uVar8 = uVar17;
          }
          for (lVar20 = 0; (ulong)uVar8 * 4 != lVar20; lVar20 = lVar20 + 4) {
            iVar30 = *(int *)((long)_index + lVar20);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar20 * 2);
            *(long *)(err_string + lVar20 * 2) = lVar21 * iVar30 + 1;
            lVar21 = ((long)iVar30 + 1) * lVar21;
            lVar31 = *(long *)((long)GA[g_a + 1000].dims + lVar20 * 2);
            if (lVar31 <= lVar21) {
              lVar21 = lVar31;
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar21;
          }
        }
        else if (iVar30 == 4) {
          lVar21 = (long)(int)uVar32 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          uVar15 = uVar32;
          lVar20 = 0;
          while (lVar20 + 1 < lVar24) {
            uVar15 = (long)((int)uVar15 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
            lVar21 = (long)(int)uVar15 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            _index[lVar20 + 1] = (int)lVar21;
            lVar20 = lVar20 + 1;
          }
          lVar20 = 0;
          if ((short)uVar17 < 1) {
            uVar17 = 0;
          }
          iVar30 = 0;
          for (; (ulong)uVar17 * 4 != lVar20; lVar20 = lVar20 + 4) {
            pCVar7 = GA[lVar1].mapc;
            iVar25 = *(int *)((long)_index + lVar20);
            lVar31 = (long)iVar30 + (long)iVar25;
            *(C_Integer *)(err_string + lVar20 * 2) = pCVar7[lVar31];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2);
            if ((long)iVar25 < lVar21 + -1) {
              lVar31 = pCVar7[lVar31 + 1] + -1;
            }
            else {
              lVar31 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
            }
            *(long *)((long)_hi + lVar20 * 2) = lVar31;
            iVar30 = iVar30 + (int)lVar21;
          }
        }
        else if (iVar30 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar20 = lVar24;
            if (lVar24 < 1) {
              lVar20 = 0;
            }
            lVar21 = 1;
            for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar31];
            }
            if (((long)uVar32 < 0) || (lVar21 <= (long)uVar32)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar31 = 0;
              uVar15 = uVar32;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar33 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar22 = (long)uVar15 % lVar33;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar21 + -0x20] = pCVar7[lVar22 + lVar31];
                if (lVar22 == lVar33 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar23 = pCVar7[lVar22 + lVar31 + 1] + -1;
                }
                lVar31 = lVar31 + lVar33;
                _hi[lVar21] = CVar23;
                uVar15 = (long)uVar15 / lVar33;
              }
            }
          }
          else if ((long)uVar32 < GA[lVar1].num_rstrctd) {
            lVar20 = lVar24;
            if (lVar24 < 1) {
              lVar20 = 0;
            }
            lVar21 = 1;
            for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar31];
            }
            if (((long)uVar32 < 0) || (lVar21 <= (long)uVar32)) {
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar31 = 0;
              uVar15 = uVar32;
              for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                lVar33 = (long)GA[g_a + 1000].nblock[lVar21];
                lVar22 = (long)uVar15 % lVar33;
                pCVar7 = GA[lVar1].mapc;
                plo_loc[lVar21 + -0x20] = pCVar7[lVar22 + lVar31];
                if (lVar22 == lVar33 + -1) {
                  CVar23 = GA[g_a + 1000].dims[lVar21];
                }
                else {
                  CVar23 = pCVar7[lVar22 + lVar31 + 1] + -1;
                }
                lVar31 = lVar31 + lVar33;
                _hi[lVar21] = CVar23;
                uVar15 = (long)uVar15 / lVar33;
              }
            }
          }
          else {
            iVar30 = 0;
            if (0 < (short)uVar17) {
              iVar30 = (int)(short)uVar17;
            }
            for (lVar20 = 0; iVar30 != lVar20; lVar20 = lVar20 + 1) {
              plo_loc[lVar20 + -0x20] = 0;
              _hi[lVar20] = -1;
            }
          }
        }
        if (lVar19 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        lVar19 = 1;
        lVar20 = 0;
        for (lVar21 = 0; lVar18 != lVar21; lVar21 = lVar21 + 1) {
          lVar20 = lVar20 + plo_rem[lVar21] * lVar19;
          lVar31 = (_hi[lVar21] - plo_loc[lVar21 + -0x20]) + GA[g_a + 1000].width[lVar21] * 2 + 1;
          ld_rem[lVar21] = lVar31;
          lVar19 = lVar19 * lVar31;
        }
        lVar24 = plo_rem[lVar24 + -1];
        pcVar6 = ppcVar5[uVar32];
        stride_loc[0] = iVar2;
        stride_rem[0] = iVar2;
        iVar30 = iVar2;
        iVar25 = iVar2;
        for (lVar18 = 0; lVar26 != lVar18; lVar18 = lVar18 + 1) {
          iVar30 = iVar30 * (int)ld_rem[lVar18];
          stride_rem[lVar18] = iVar30;
          iVar25 = iVar25 * (int)ld_loc[lVar18];
          stride_loc[lVar18] = iVar25;
          stride_rem[lVar18 + 1] = iVar30;
          stride_loc[lVar18 + 1] = iVar25;
        }
        for (lVar18 = 0; lVar34 != lVar18; lVar18 = lVar18 + 1) {
          count[lVar18] = ((int)phi_rem[lVar18] - (int)plo_rem[lVar18]) + 1;
        }
        count[0] = count[0] * iVar2;
        if (-1 < iVar3) {
          uVar32 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar32];
        }
        ARMCI_PutS(pcVar28 + (lVar29 * lVar16 + lVar14) * (long)iVar27,stride_loc,
                   pcVar6 + (lVar19 * lVar24 + lVar20) * (long)iVar27,stride_rem,count,(int)lVar11,
                   (int)uVar32);
      }
      if (idx < lVar11) {
        pnga_pgroup_sync(grp_id);
      }
      increment[idx] = lVar4 * 2;
    }
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update3_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension. This implementation uses simple put
   * operations to perform the updates along each dimension with an
   * intervening synchronization call being used to make sure that the
   * necessary data is available on each processor before starting the
   * update along the next dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);

      /* Perform update in positive direction */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* get remote data */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    increment[idx] = 2*nwidth;
  }
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}